

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int cbs_get_two_digits(CBS *cbs,int *out)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  byte *in_RCX;
  int iVar5;
  
  sVar3 = cbs->len;
  if (sVar3 != 0) {
    in_RCX = cbs->data;
    cbs->data = in_RCX + 1;
    cbs->len = sVar3 - 1;
  }
  iVar5 = 0;
  if (sVar3 != 0) {
    bVar1 = *in_RCX;
    iVar4 = OPENSSL_isdigit((uint)bVar1);
    iVar5 = 0;
    if (iVar4 != 0) {
      sVar3 = cbs->len;
      if (sVar3 != 0) {
        in_RCX = cbs->data;
        cbs->data = in_RCX + 1;
        cbs->len = sVar3 - 1;
      }
      iVar5 = 0;
      if (sVar3 != 0) {
        bVar2 = *in_RCX;
        iVar4 = OPENSSL_isdigit((uint)bVar2);
        if (iVar4 != 0) {
          *out = (uint)bVar2 + (uint)bVar1 * 10 + -0x210;
          iVar5 = 1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int cbs_get_two_digits(CBS *cbs, int *out) {
  uint8_t first_digit, second_digit;
  if (!CBS_get_u8(cbs, &first_digit)) {
    return 0;
  }
  if (!OPENSSL_isdigit(first_digit)) {
    return 0;
  }
  if (!CBS_get_u8(cbs, &second_digit)) {
    return 0;
  }
  if (!OPENSSL_isdigit(second_digit)) {
    return 0;
  }
  *out = (first_digit - '0') * 10 + (second_digit - '0');
  return 1;
}